

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getDefaultCamera(TutorialScene *this)

{
  size_type sVar1;
  reference pvVar2;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  *in_RSI;
  PerspectiveCameraNode *in_RDI;
  
  sVar1 = std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::size(in_RSI);
  if (sVar1 == 0) {
    (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)0x0;
    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
    }
  }
  else {
    pvVar2 = std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::operator[](in_RSI,0);
    (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)pvVar2->ptr;
    if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
    }
  }
  return (Ref<embree::SceneGraph::PerspectiveCameraNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getDefaultCamera()
  {
    if (cameras.size()) return cameras[0];
    return nullptr;
  }